

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O2

ppc_slb_t * slb_lookup(PowerPCCPU_conflict3 *cpu,target_ulong eaddr)

{
  ppc_slb_t *ppVar1;
  ppc_slb_t *ppVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  ppVar2 = (cpu->env).slb;
  uVar3 = (ulong)cpu->hash64_opts->slb_size;
  lVar4 = 0;
  ppVar1 = ppVar2;
  while( true ) {
    bVar5 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar5) {
      return (ppc_slb_t *)0x0;
    }
    if ((ppVar1->esid == (eaddr & 0xfffffffff0000000 | 0x8000000)) &&
       (ppVar1->vsid < 0x4000000000000000)) break;
    if ((ppVar1->esid == (eaddr & 0xffffff0000000000 | 0x8000000)) &&
       ((ppVar1->vsid & 0xc000000000000000) == 0x4000000000000000)) {
      return ppVar1;
    }
    lVar4 = lVar4 + 1;
    ppVar1 = ppVar1 + 1;
  }
  return ppVar2 + lVar4;
}

Assistant:

static ppc_slb_t *slb_lookup(PowerPCCPU *cpu, target_ulong eaddr)
{
    CPUPPCState *env = &cpu->env;
    uint64_t esid_256M, esid_1T;
    int n;

    LOG_SLB("%s: eaddr " TARGET_FMT_lx "\n", __func__, eaddr);

    esid_256M = (eaddr & SEGMENT_MASK_256M) | SLB_ESID_V;
    esid_1T = (eaddr & SEGMENT_MASK_1T) | SLB_ESID_V;

    for (n = 0; n < cpu->hash64_opts->slb_size; n++) {
        ppc_slb_t *slb = &env->slb[n];

        LOG_SLB("%s: slot %d %016" PRIx64 " %016"
                    PRIx64 "\n", __func__, n, slb->esid, slb->vsid);
        /*
         * We check for 1T matches on all MMUs here - if the MMU
         * doesn't have 1T segment support, we will have prevented 1T
         * entries from being inserted in the slbmte code.
         */
        if (((slb->esid == esid_256M) &&
             ((slb->vsid & SLB_VSID_B) == SLB_VSID_B_256M))
            || ((slb->esid == esid_1T) &&
                ((slb->vsid & SLB_VSID_B) == SLB_VSID_B_1T))) {
            return slb;
        }
    }

    return NULL;
}